

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

CURLcode mqtt_doing(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  char *ptr;
  uchar *puStack_58;
  uchar byte;
  uchar *pkt;
  long lStack_48;
  curl_socket_t sockfd;
  ssize_t nread;
  MQTT *mq;
  mqtt_conn *mqtt;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  mqtt = (mqtt_conn *)data->conn;
  mq = (MQTT *)&((connectdata *)mqtt)->proto;
  nread = (ssize_t)(data->req).p.mqtt;
  pkt._4_4_ = ((connectdata *)mqtt)->sock[0];
  puStack_58 = (uchar *)(data->state).buffer;
  *done = false;
  p_Stack_20 = done;
  done_local = (_Bool *)data;
  if (((MQTT *)nread)->nsend != 0) {
    pcVar1 = ((MQTT *)nread)->sendleftovers;
    conn._4_4_ = mqtt_send(data,((MQTT *)nread)->sendleftovers,((MQTT *)nread)->nsend);
    (*Curl_cfree)(pcVar1);
    if (conn._4_4_ != CURLE_OK) {
      return conn._4_4_;
    }
  }
  Curl_infof((Curl_easy *)done_local,"mqtt_doing: state [%d]",(ulong)*(uint *)&mq->sendleftovers);
  switch(*(undefined4 *)&mq->sendleftovers) {
  case 0:
    conn._4_4_ = Curl_read((Curl_easy *)done_local,pkt._4_4_,(char *)(nread + 0x18),1,
                           &stack0xffffffffffffffb8);
    if (lStack_48 == 0) break;
    Curl_debug((Curl_easy *)done_local,CURLINFO_HEADER_IN,(char *)(nread + 0x18),1);
    *(undefined8 *)(nread + 0x10) = 0;
    mqstate((Curl_easy *)done_local,MQTT_REMAINING_LENGTH,MQTT_NOSTATE);
  case 1:
    do {
      conn._4_4_ = Curl_read((Curl_easy *)done_local,pkt._4_4_,(char *)((long)&ptr + 7),1,
                             &stack0xffffffffffffffb8);
      if (lStack_48 == 0) break;
      Curl_debug((Curl_easy *)done_local,CURLINFO_HEADER_IN,(char *)((long)&ptr + 7),1);
      lVar2 = *(long *)(nread + 0x10);
      *(long *)(nread + 0x10) = lVar2 + 1;
      puStack_58[lVar2] = ptr._7_1_;
      bVar4 = false;
      if ((ptr._7_1_ & 0x80) != 0) {
        bVar4 = *(ulong *)(nread + 0x10) < 4;
      }
    } while (bVar4);
    if ((lStack_48 != 0) && ((ptr._7_1_ & 0x80) != 0)) {
      conn._4_4_ = CURLE_WEIRD_SERVER_REPLY;
    }
    if (conn._4_4_ == CURLE_OK) {
      sVar3 = mqtt_decode_len(puStack_58,*(size_t *)(nread + 0x10),(size_t *)0x0);
      *(size_t *)(nread + 0x20) = sVar3;
      *(undefined8 *)(nread + 0x10) = 0;
      if (*(long *)(nread + 0x20) == 0) {
        mqstate((Curl_easy *)done_local,MQTT_FIRST,MQTT_FIRST);
        if (*(char *)(nread + 0x18) == -0x20) {
          Curl_infof((Curl_easy *)done_local,"Got DISCONNECT");
          *p_Stack_20 = true;
        }
      }
      else {
        mqstate((Curl_easy *)done_local,*(mqttstate *)((long)&mq->sendleftovers + 4),MQTT_NOSTATE);
      }
    }
    break;
  case 2:
    conn._4_4_ = mqtt_verify_connack((Curl_easy *)done_local);
    if (conn._4_4_ == CURLE_OK) {
      if (*(int *)(done_local + 0x1290) == 1) {
        conn._4_4_ = mqtt_publish((Curl_easy *)done_local);
        if (conn._4_4_ == CURLE_OK) {
          conn._4_4_ = mqtt_disconnect((Curl_easy *)done_local);
          *p_Stack_20 = true;
        }
        *(undefined4 *)((long)&mq->sendleftovers + 4) = 0;
      }
      else {
        conn._4_4_ = mqtt_subscribe((Curl_easy *)done_local);
        if (conn._4_4_ == CURLE_OK) {
          mqstate((Curl_easy *)done_local,MQTT_FIRST,MQTT_SUBACK);
        }
      }
    }
    break;
  case 3:
  case 5:
  case 6:
    conn._4_4_ = mqtt_read_publish((Curl_easy *)done_local,p_Stack_20);
    break;
  default:
    Curl_failf((Curl_easy *)done_local,"State not handled yet");
    *p_Stack_20 = true;
  }
  if (conn._4_4_ == CURLE_AGAIN) {
    conn._4_4_ = CURLE_OK;
  }
  return conn._4_4_;
}

Assistant:

static CURLcode mqtt_doing(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct mqtt_conn *mqtt = &conn->proto.mqtt;
  struct MQTT *mq = data->req.p.mqtt;
  ssize_t nread;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
  unsigned char *pkt = (unsigned char *)data->state.buffer;
  unsigned char byte;

  *done = FALSE;

  if(mq->nsend) {
    /* send the remainder of an outgoing packet */
    char *ptr = mq->sendleftovers;
    result = mqtt_send(data, mq->sendleftovers, mq->nsend);
    free(ptr);
    if(result)
      return result;
  }

  infof(data, "mqtt_doing: state [%d]", (int) mqtt->state);
  switch(mqtt->state) {
  case MQTT_FIRST:
    /* Read the initial byte only */
    result = Curl_read(data, sockfd, (char *)&mq->firstbyte, 1, &nread);
    if(!nread)
      break;
    Curl_debug(data, CURLINFO_HEADER_IN, (char *)&mq->firstbyte, 1);
    /* remember the first byte */
    mq->npacket = 0;
    mqstate(data, MQTT_REMAINING_LENGTH, MQTT_NOSTATE);
    /* FALLTHROUGH */
  case MQTT_REMAINING_LENGTH:
    do {
      result = Curl_read(data, sockfd, (char *)&byte, 1, &nread);
      if(!nread)
        break;
      Curl_debug(data, CURLINFO_HEADER_IN, (char *)&byte, 1);
      pkt[mq->npacket++] = byte;
    } while((byte & 0x80) && (mq->npacket < 4));
    if(nread && (byte & 0x80))
      /* MQTT supports up to 127 * 128^0 + 127 * 128^1 + 127 * 128^2 +
         127 * 128^3 bytes. server tried to send more */
      result = CURLE_WEIRD_SERVER_REPLY;
    if(result)
      break;
    mq->remaining_length = mqtt_decode_len(&pkt[0], mq->npacket, NULL);
    mq->npacket = 0;
    if(mq->remaining_length) {
      mqstate(data, mqtt->nextstate, MQTT_NOSTATE);
      break;
    }
    mqstate(data, MQTT_FIRST, MQTT_FIRST);

    if(mq->firstbyte == MQTT_MSG_DISCONNECT) {
      infof(data, "Got DISCONNECT");
      *done = TRUE;
    }
    break;
  case MQTT_CONNACK:
    result = mqtt_verify_connack(data);
    if(result)
      break;

    if(data->state.httpreq == HTTPREQ_POST) {
      result = mqtt_publish(data);
      if(!result) {
        result = mqtt_disconnect(data);
        *done = TRUE;
      }
      mqtt->nextstate = MQTT_FIRST;
    }
    else {
      result = mqtt_subscribe(data);
      if(!result) {
        mqstate(data, MQTT_FIRST, MQTT_SUBACK);
      }
    }
    break;

  case MQTT_SUBACK:
  case MQTT_PUBWAIT:
  case MQTT_PUB_REMAIN:
    result = mqtt_read_publish(data, done);
    break;

  default:
    failf(data, "State not handled yet");
    *done = TRUE;
    break;
  }

  if(result == CURLE_AGAIN)
    result = CURLE_OK;
  return result;
}